

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsmp.cc
# Opt level: O3

void __thiscall
bsplib::Bsmp::Bsmp(Bsmp *this,MPI_Comm comm,size_t max_msg_size,size_t small_exch_size)

{
  this->m_total_n_messages = 0;
  this->m_total_payload = 0;
  this->m_send_tag_size = 0;
  this->m_next_tag_size = 0;
  this->m_set_tag_size_counter = 0;
  this->m_recv_tag_size = 0;
  this->m_send_empty = true;
  A2A::A2A(&this->m_a2a,comm,max_msg_size,small_exch_size,10000.0,1.0,RMA);
  (this->m_tag_buffer).m_alignment = 0x10;
  (this->m_tag_buffer).m_ptr = (void *)0x0;
  (this->m_tag_buffer).m_aligned_ptr = (void *)0x0;
  (this->m_tag_buffer).m_capacity = 0;
  (this->m_tag_buffer).m_size = 0;
  (this->m_payloads).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_payloads).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_payloads).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_payload_buffer).m_alignment = 0x10;
  (this->m_payload_buffer).m_ptr = (void *)0x0;
  (this->m_payload_buffer).m_aligned_ptr = (void *)0x0;
  (this->m_payload_buffer).m_capacity = 0;
  (this->m_payload_buffer).m_size = 0;
  return;
}

Assistant:

Bsmp::Bsmp(MPI_Comm comm, size_t max_msg_size, size_t small_exch_size)
    : m_set_tag_size_counter(0)
    , m_recv_tag_size(0)
    , m_send_tag_size(0)
    , m_next_tag_size(0)
    , m_total_n_messages(0)
    , m_total_payload(0)
    , m_send_empty(true)
    , m_a2a(comm, max_msg_size, small_exch_size )
    , m_tag_buffer()
    , m_payloads()
    , m_payload_buffer()
{

}